

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  MUFile *muf_00;
  String *value;
  pointer ppVar1;
  pointer ppVar2;
  pointer ppMVar3;
  bool bVar4;
  ulong uVar5;
  string *value_00;
  cmake *pcVar6;
  Value *pVVar7;
  Value *pVVar8;
  Value *pVVar9;
  long lVar10;
  pointer ppMVar11;
  ArrayIndex AVar12;
  __node_base *p_Var13;
  __node_base *p_Var14;
  pointer value_01;
  pointer value_02;
  __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
  __i;
  long lVar15;
  pointer ppMVar16;
  MUFile *muf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [2];
  allocator<char> local_1b1;
  undefined1 local_1b0 [48];
  InfoWriter info;
  anon_class_8_1_8991fb9c MfDef;
  Value local_150;
  string local_128;
  Value *local_108;
  Value *local_100;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sources;
  String local_d8;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  headers;
  anon_class_8_1_8991fb9c cfgArray;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  
  moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &moc_skip._M_t._M_impl.super__Rb_tree_header._M_header;
  moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uic_skip._M_t._M_impl.super__Rb_tree_header._M_header;
  uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  headers.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headers.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MfDef.this = this;
  uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uic_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       moc_skip._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::reserve(&headers,(this->AutogenTarget).Headers._M_h._M_element_count);
  p_Var13 = &(this->AutogenTarget).Headers._M_h._M_before_begin;
  while (ppMVar11 = headers.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        ppMVar3 = headers.
                  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, p_Var13 = p_Var13->_M_nxt,
        p_Var13 != (__node_base *)0x0) {
    muf = *(MUFile **)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor;
    if (muf->SkipMoc == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&moc_skip,&muf->FullPath);
    }
    if (muf->SkipUic == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&uic_skip,&muf->FullPath);
    }
    if (((muf->Generated != true) || (this->CMP0071Accept == true)) &&
       ((muf->MocIt != false || (muf->UicIt == true)))) {
      std::
      vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
      ::emplace_back<cmQtAutoGenInitializer::MUFile_const*const&>
                ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                  *)&headers,&muf);
    }
  }
  if (headers.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      headers.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)headers.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)headers.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = lVar15 >> 3;
    lVar10 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
              (headers.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               headers.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (ppMVar3,ppMVar11);
    }
    else {
      ppMVar16 = ppMVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (ppMVar3,ppMVar16);
      for (; ppMVar16 != ppMVar11; ppMVar16 = ppMVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (ppMVar16);
      }
    }
  }
  std::
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::reserve(&sources,(this->AutogenTarget).Sources._M_h._M_element_count);
  p_Var13 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
  while (ppMVar11 = sources.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        ppMVar3 = sources.
                  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, p_Var13 = p_Var13->_M_nxt,
        p_Var13 != (__node_base *)0x0) {
    muf = *(MUFile **)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor;
    if ((muf->Generated != true) || (this->CMP0071Accept == true)) {
      if (muf->SkipMoc == true) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&moc_skip,&muf->FullPath);
      }
      if (muf->SkipUic == true) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&uic_skip,&muf->FullPath);
      }
      if ((muf->MocIt != false) || (muf->UicIt == true)) {
        std::
        vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
        ::emplace_back<cmQtAutoGenInitializer::MUFile_const*const&>
                  ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                    *)&sources,&muf);
      }
    }
  }
  if (sources.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      sources.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)sources.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)sources.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = lVar15 >> 3;
    lVar10 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
              (sources.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               sources.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (ppMVar3,ppMVar11);
    }
    else {
      ppMVar16 = ppMVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (ppMVar3,ppMVar16);
      for (; ppMVar16 != ppMVar11; ppMVar16 = ppMVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (ppMVar16);
      }
    }
  }
  anon_unknown.dwarf_8937a7::InfoWriter::InfoWriter(&info);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"MULTI_CONFIG",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetBool(&info,(string *)&muf,this->MultiConfig);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"PARALLEL",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetUInt
            (&info,(string *)&muf,(this->AutogenTarget).Parallel);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"VERBOSITY",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetUInt(&info,(string *)&muf,this->Verbosity);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_SOURCE_DIR",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_SOURCE_DIR",(allocator<char> *)&local_d8);
  SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
            ((string *)local_1b0,&MfDef,(string *)&local_150);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_BINARY_DIR",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_BINARY_DIR",(allocator<char> *)&local_d8);
  SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
            ((string *)local_1b0,&MfDef,(string *)&local_150);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_CURRENT_SOURCE_DIR",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_CURRENT_SOURCE_DIR",(allocator<char> *)&local_d8);
  SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
            ((string *)local_1b0,&MfDef,(string *)&local_150);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_CURRENT_BINARY_DIR",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_CURRENT_BINARY_DIR",(allocator<char> *)&local_d8);
  SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
            ((string *)local_1b0,&MfDef,(string *)&local_150);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"BUILD_DIR",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,&(this->Dir).Build);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"INCLUDE_DIR",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetConfig(&info,(string *)&muf,&(this->Dir).Include);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"QT_VERSION_MAJOR",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetUInt(&info,(string *)&muf,(this->QtVersion).Major);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"QT_VERSION_MINOR",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetUInt(&info,(string *)&muf,(this->QtVersion).Minor);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"QT_MOC_EXECUTABLE",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::Set
            (&info,(string *)&muf,&(this->Moc).super_GenVarsT.Executable);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"QT_UIC_EXECUTABLE",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::Set
            (&info,(string *)&muf,&(this->Uic).super_GenVarsT.Executable);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_EXECUTABLE",(allocator<char> *)local_1b0);
  value_00 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,value_00);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"SETTINGS_FILE",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetConfig
            (&info,(string *)&muf,&(this->AutogenTarget).SettingsFile);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"PARSE_CACHE_FILE",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::SetConfig
            (&info,(string *)&muf,&(this->AutogenTarget).ParseCacheFile);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"DEP_FILE",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::Set(&info,(string *)&muf,&(this->AutogenTarget).DepFile);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"DEP_FILE_RULE_NAME",(allocator<char> *)local_1b0);
  anon_unknown.dwarf_8937a7::InfoWriter::Set
            (&info,(string *)&muf,&(this->AutogenTarget).DepFileRuleName);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"CMAKE_LIST_FILES",(allocator<char> *)local_1b0);
  (anonymous_namespace)::InfoWriter::
  SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((InfoWriter *)&info,(string *)&muf,&this->Makefile->ListFiles);
  std::__cxx11::string::~string((string *)&muf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&muf,"HEADER_EXTENSIONS",(allocator<char> *)local_1b0);
  pcVar6 = cmMakefile::GetCMakeInstance(this->Makefile);
  (anonymous_namespace)::InfoWriter::
  SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((InfoWriter *)&info,(string *)&muf,&(pcVar6->HeaderFileExtensions).ordered);
  std::__cxx11::string::~string((string *)&muf);
  cfgArray.this = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"HEADERS",&local_1b1);
  pVVar7 = Json::Value::operator[](&info.Value_,&local_d8);
  bVar4 = (anonymous_namespace)::InfoWriter::
          MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
                    (pVVar7,&headers);
  ppMVar3 = headers.
            super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = pVVar7;
  if (bVar4) {
    AVar12 = 0;
    for (ppMVar11 = headers.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppMVar11 != ppMVar3;
        ppMVar11 = ppMVar11 + 1) {
      local_100 = (Value *)CONCAT44(local_100._4_4_,AVar12);
      pVVar7 = Json::Value::operator[](local_108,AVar12);
      Json::Value::Value((Value *)&muf,arrayValue);
      Json::Value::operator=(pVVar7,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      muf_00 = *ppMVar11;
      Json::Value::resize(pVVar7,4);
      Json::Value::Value((Value *)&muf,&muf_00->FullPath);
      pVVar8 = Json::Value::operator[](pVVar7,0);
      Json::Value::operator=(pVVar8,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      local_1d8[0]._0_1_ = (muf_00->MocIt ^ 1U) << 5 | 0x4d;
      muf = (MUFile *)&DAT_00000001;
      local_1e0 = local_1d8;
      local_1b0[0x10] = (muf_00->UicIt ^ 1U) << 5 | 0x55;
      local_1b0._0_8_ = &DAT_00000001;
      local_1b0._8_8_ = local_1b0 + 0x10;
      cmStrCat<>(&local_128,(cmAlphaNum *)&muf,(cmAlphaNum *)local_1b0);
      Json::Value::Value(&local_150,&local_128);
      pVVar8 = Json::Value::operator[](pVVar7,1);
      Json::Value::operator=(pVVar8,&local_150);
      Json::Value::~Value(&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      GetMocBuildPath_abi_cxx11_((string *)local_1b0,this,muf_00);
      Json::Value::Value((Value *)&muf,(String *)local_1b0);
      pVVar8 = Json::Value::operator[](pVVar7,2);
      Json::Value::operator=(pVVar8,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      std::__cxx11::string::~string((string *)local_1b0);
      SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
                ((Value *)&muf,&cfgArray,&muf_00->Configs);
      pVVar7 = Json::Value::operator[](pVVar7,3);
      Json::Value::operator=(pVVar7,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      AVar12 = (int)local_100 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"SOURCES",&local_1b1);
  pVVar7 = Json::Value::operator[](&info.Value_,&local_d8);
  bVar4 = (anonymous_namespace)::InfoWriter::
          MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
                    (pVVar7,&sources);
  local_100 = pVVar7;
  if (bVar4) {
    local_108 = (Value *)sources.
                         super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    AVar12 = 0;
    for (pVVar7 = (Value *)sources.
                           super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; pVVar7 != local_108;
        pVVar7 = (Value *)&pVVar7->bits_) {
      pVVar8 = Json::Value::operator[](local_100,AVar12);
      Json::Value::Value((Value *)&muf,arrayValue);
      Json::Value::operator=(pVVar8,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      value = (String *)(pVVar7->value_).map_;
      Json::Value::resize(pVVar8,3);
      Json::Value::Value((Value *)&muf,value);
      pVVar9 = Json::Value::operator[](pVVar8,0);
      Json::Value::operator=(pVVar9,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      local_1d8[0]._0_1_ = (*(byte *)((long)&value[2]._M_dataplus._M_p + 3) ^ 1) << 5 | 0x4d;
      muf = (MUFile *)&DAT_00000001;
      local_1e0 = local_1d8;
      local_1b0[0x10] = (*(byte *)((long)&value[2]._M_dataplus._M_p + 4) ^ 1) << 5 | 0x55;
      local_1b0._0_8_ = &DAT_00000001;
      local_1b0._8_8_ = local_1b0 + 0x10;
      cmStrCat<>(&local_128,(cmAlphaNum *)&muf,(cmAlphaNum *)local_1b0);
      Json::Value::Value(&local_150,&local_128);
      pVVar9 = Json::Value::operator[](pVVar8,1);
      Json::Value::operator=(pVVar9,&local_150);
      Json::Value::~Value(&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
                ((Value *)&muf,&cfgArray,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&value[1]._M_string_length
                );
      pVVar8 = Json::Value::operator[](pVVar8,2);
      Json::Value::operator=(pVVar8,(Value *)&muf);
      Json::Value::~Value((Value *)&muf);
      AVar12 = AVar12 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_d8);
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_SKIP",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&moc_skip);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"MOC_DEFINITIONS",(allocator<char> *)&local_d8);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,&local_128,&(this->Moc).Defines.Default);
    p_Var14 = &(this->Moc).Defines.Config._M_h._M_before_begin;
    while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
      muf = (MUFile *)local_128._M_string_length;
      local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p;
      local_1b0._0_8_ = &DAT_00000001;
      local_1b0[0x10] = 0x5f;
      local_1b0._8_8_ = local_1b0 + 0x10;
      cmStrCat<std::__cxx11::string>
                ((string *)&local_150,(cmAlphaNum *)&muf,(cmAlphaNum *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var14 + 1))
      ;
      (anonymous_namespace)::InfoWriter::
      SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)&info,(string *)&local_150,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var14 + 5));
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_INCLUDES",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Moc).Includes);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_OPTIONS",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Moc).Options);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_RELAXED_MODE",(allocator<char> *)local_1b0);
    anon_unknown.dwarf_8937a7::InfoWriter::SetBool(&info,(string *)&muf,(this->Moc).RelaxedMode);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_PATH_PREFIX",(allocator<char> *)local_1b0);
    anon_unknown.dwarf_8937a7::InfoWriter::SetBool(&info,(string *)&muf,(this->Moc).PathPrefix);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_MACRO_NAMES",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Moc).MacroNames);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"MOC_DEPEND_FILTERS",(allocator<char> *)&local_150);
    pVVar7 = Json::Value::operator[](&info.Value_,(String *)local_1b0);
    Json::Value::Value((Value *)&muf,arrayValue);
    Json::Value::operator=(pVVar7,(Value *)&muf);
    Json::Value::~Value((Value *)&muf);
    uVar5 = (long)(this->Moc).DependFilters.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Moc).DependFilters.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 != 0) {
      Json::Value::resize(pVVar7,(ArrayIndex)(uVar5 >> 6));
      ppVar1 = (this->Moc).DependFilters.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      AVar12 = 0;
      for (value_01 = (this->Moc).DependFilters.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; value_01 != ppVar1;
          value_01 = value_01 + 1) {
        pVVar8 = Json::Value::operator[](pVVar7,AVar12);
        Json::Value::Value((Value *)&muf,arrayValue);
        Json::Value::operator=(pVVar8,(Value *)&muf);
        Json::Value::~Value((Value *)&muf);
        Json::Value::resize(pVVar8,2);
        Json::Value::Value((Value *)&muf,&value_01->first);
        pVVar9 = Json::Value::operator[](pVVar8,0);
        Json::Value::operator=(pVVar9,(Value *)&muf);
        Json::Value::~Value((Value *)&muf);
        Json::Value::Value((Value *)&muf,&value_01->second);
        pVVar8 = Json::Value::operator[](pVVar8,1);
        Json::Value::operator=(pVVar8,(Value *)&muf);
        Json::Value::~Value((Value *)&muf);
        AVar12 = AVar12 + 1;
      }
    }
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_COMPILATION_FILE",(allocator<char> *)local_1b0);
    anon_unknown.dwarf_8937a7::InfoWriter::SetConfig
              (&info,(string *)&muf,&(this->Moc).CompilationFile);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_PREDEFS_CMD",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Moc).PredefsCmd);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"MOC_PREDEFS_FILE",(allocator<char> *)local_1b0);
    anon_unknown.dwarf_8937a7::InfoWriter::SetConfig(&info,(string *)&muf,&(this->Moc).PredefsFile);
    std::__cxx11::string::~string((string *)&muf);
  }
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&uic_skip,(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(this->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"UIC_SKIP",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&uic_skip);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"UIC_UI_FILES",(allocator<char> *)&local_150);
    pVVar7 = Json::Value::operator[](&info.Value_,(String *)local_1b0);
    Json::Value::Value((Value *)&muf,arrayValue);
    Json::Value::operator=(pVVar7,(Value *)&muf);
    Json::Value::~Value((Value *)&muf);
    lVar10 = (long)(this->Uic).UiFilesWithOptions.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Uic).UiFilesWithOptions.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar10 != 0) {
      Json::Value::resize(pVVar7,(ArrayIndex)(lVar10 / 0x38));
      ppVar2 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      AVar12 = 0;
      for (value_02 = (this->Uic).UiFilesWithOptions.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; value_02 != ppVar2;
          value_02 = value_02 + 1) {
        pVVar8 = Json::Value::operator[](pVVar7,AVar12);
        Json::Value::Value((Value *)&muf,arrayValue);
        Json::Value::operator=(pVVar8,(Value *)&muf);
        Json::Value::~Value((Value *)&muf);
        Json::Value::resize(pVVar8,2);
        Json::Value::Value((Value *)&muf,&value_02->first);
        pVVar9 = Json::Value::operator[](pVVar8,0);
        Json::Value::operator=(pVVar9,(Value *)&muf);
        Json::Value::~Value((Value *)&muf);
        pVVar8 = Json::Value::operator[](pVVar8,1);
        (anonymous_namespace)::InfoWriter::
        MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (pVVar8,&value_02->second);
        AVar12 = AVar12 + 1;
      }
    }
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"UIC_OPTIONS",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Uic).Options);
    std::__cxx11::string::~string((string *)&muf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&muf,"UIC_SEARCH_PATHS",(allocator<char> *)local_1b0);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&info,(string *)&muf,&(this->Uic).SearchPaths);
    std::__cxx11::string::~string((string *)&muf);
  }
  anon_unknown.dwarf_8937a7::InfoWriter::Save(&info,&(this->AutogenTarget).InfoFile);
  Json::Value::~Value(&info.Value_);
  std::
  _Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::~_Vector_base(&sources.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 );
  std::
  _Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::~_Vector_base(&headers.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&uic_skip._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&moc_skip._M_t);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  // Utility lambdas
  auto MfDef = [this](std::string const& key) {
    return this->Makefile->GetSafeDefinition(key);
  };

  // Filtered headers and sources
  std::set<std::string> moc_skip;
  std::set<std::string> uic_skip;
  std::vector<MUFile const*> headers;
  std::vector<MUFile const*> sources;

  // Filter headers
  {
    headers.reserve(this->AutogenTarget.Headers.size());
    for (auto const& pair : this->AutogenTarget.Headers) {
      MUFile const* const muf = pair.second.get();
      if (muf->SkipMoc) {
        moc_skip.insert(muf->FullPath);
      }
      if (muf->SkipUic) {
        uic_skip.insert(muf->FullPath);
      }
      if (muf->Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf->MocIt || muf->UicIt) {
        headers.emplace_back(muf);
      }
    }
    std::sort(headers.begin(), headers.end(),
              [](MUFile const* a, MUFile const* b) {
                return (a->FullPath < b->FullPath);
              });
  }

  // Filter sources
  {
    sources.reserve(this->AutogenTarget.Sources.size());
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const* const muf = pair.second.get();
      if (muf->Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf->SkipMoc) {
        moc_skip.insert(muf->FullPath);
      }
      if (muf->SkipUic) {
        uic_skip.insert(muf->FullPath);
      }
      if (muf->MocIt || muf->UicIt) {
        sources.emplace_back(muf);
      }
    }
    std::sort(sources.begin(), sources.end(),
              [](MUFile const* a, MUFile const* b) {
                return (a->FullPath < b->FullPath);
              });
  }

  // Info writer
  InfoWriter info;

  // General
  info.SetBool("MULTI_CONFIG", this->MultiConfig);
  info.SetUInt("PARALLEL", this->AutogenTarget.Parallel);
  info.SetUInt("VERBOSITY", this->Verbosity);

  // Directories
  info.Set("CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
  info.Set("CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
  info.Set("CMAKE_CURRENT_SOURCE_DIR", MfDef("CMAKE_CURRENT_SOURCE_DIR"));
  info.Set("CMAKE_CURRENT_BINARY_DIR", MfDef("CMAKE_CURRENT_BINARY_DIR"));
  info.Set("BUILD_DIR", this->Dir.Build);
  info.SetConfig("INCLUDE_DIR", this->Dir.Include);

  info.SetUInt("QT_VERSION_MAJOR", this->QtVersion.Major);
  info.SetUInt("QT_VERSION_MINOR", this->QtVersion.Minor);
  info.Set("QT_MOC_EXECUTABLE", this->Moc.Executable);
  info.Set("QT_UIC_EXECUTABLE", this->Uic.Executable);

  info.Set("CMAKE_EXECUTABLE", cmSystemTools::GetCMakeCommand());
  info.SetConfig("SETTINGS_FILE", this->AutogenTarget.SettingsFile);
  info.SetConfig("PARSE_CACHE_FILE", this->AutogenTarget.ParseCacheFile);
  info.Set("DEP_FILE", this->AutogenTarget.DepFile);
  info.Set("DEP_FILE_RULE_NAME", this->AutogenTarget.DepFileRuleName);
  info.SetArray("CMAKE_LIST_FILES", this->Makefile->GetListFiles());
  info.SetArray("HEADER_EXTENSIONS",
                this->Makefile->GetCMakeInstance()->GetHeaderExtensions());
  auto cfgArray = [this](std::vector<size_t> const& configs) -> Json::Value {
    Json::Value value;
    if (!configs.empty()) {
      value = Json::arrayValue;
      for (size_t ci : configs) {
        value.append(this->ConfigsList[ci]);
      }
    }
    return value;
  };
  info.SetArrayArray("HEADERS", headers,
                     [this, &cfgArray](Json::Value& jval, MUFile const* muf) {
                       jval.resize(4u);
                       jval[0u] = muf->FullPath;
                       jval[1u] = cmStrCat(muf->MocIt ? 'M' : 'm',
                                           muf->UicIt ? 'U' : 'u');
                       jval[2u] = this->GetMocBuildPath(*muf);
                       jval[3u] = cfgArray(muf->Configs);
                     });
  info.SetArrayArray(
    "SOURCES", sources, [&cfgArray](Json::Value& jval, MUFile const* muf) {
      jval.resize(3u);
      jval[0u] = muf->FullPath;
      jval[1u] = cmStrCat(muf->MocIt ? 'M' : 'm', muf->UicIt ? 'U' : 'u');
      jval[2u] = cfgArray(muf->Configs);
    });

  // Write moc settings
  if (this->Moc.Enabled) {
    info.SetArray("MOC_SKIP", moc_skip);
    info.SetConfigArray("MOC_DEFINITIONS", this->Moc.Defines);
    info.SetConfigArray("MOC_INCLUDES", this->Moc.Includes);
    info.SetArray("MOC_OPTIONS", this->Moc.Options);
    info.SetBool("MOC_RELAXED_MODE", this->Moc.RelaxedMode);
    info.SetBool("MOC_PATH_PREFIX", this->Moc.PathPrefix);
    info.SetArray("MOC_MACRO_NAMES", this->Moc.MacroNames);
    info.SetArrayArray(
      "MOC_DEPEND_FILTERS", this->Moc.DependFilters,
      [](Json::Value& jval, std::pair<std::string, std::string> const& pair) {
        jval.resize(2u);
        jval[0u] = pair.first;
        jval[1u] = pair.second;
      });
    info.SetConfig("MOC_COMPILATION_FILE", this->Moc.CompilationFile);
    info.SetArray("MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    info.SetConfig("MOC_PREDEFS_FILE", this->Moc.PredefsFile);
  }

  // Write uic settings
  if (this->Uic.Enabled) {
    // Add skipped .ui files
    uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

    info.SetArray("UIC_SKIP", uic_skip);
    info.SetArrayArray("UIC_UI_FILES", this->Uic.UiFilesWithOptions,
                       [](Json::Value& jval, UicT::UiFileT const& uiFile) {
                         jval.resize(2u);
                         jval[0u] = uiFile.first;
                         InfoWriter::MakeStringArray(jval[1u], uiFile.second);
                       });
    info.SetConfigArray("UIC_OPTIONS", this->Uic.Options);
    info.SetArray("UIC_SEARCH_PATHS", this->Uic.SearchPaths);
  }

  info.Save(this->AutogenTarget.InfoFile);

  return true;
}